

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcp251xfd-dump.c
# Opt level: O0

void mcp251xfd_dump_ring_obj_data(mcp251xfd_priv *priv,u8 *data,u8 dlc)

{
  byte bVar1;
  byte in_DL;
  byte *in_RSI;
  __u8 __min2;
  __u8 __min1;
  u8 len;
  int i;
  int local_18;
  
  if (0xe < in_DL) {
    in_DL = 0xf;
  }
  bVar1 = can_dlc2len(in_DL);
  if (bVar1 == 0) {
    fprintf(_stdout,"%16s = -none-\n","data");
  }
  else {
    for (local_18 = 0; local_18 < (int)(uint)bVar1; local_18 = local_18 + 1) {
      if (local_18 % 8 == 0) {
        if (local_18 == 0) {
          fprintf(_stdout,"%16s = %02x","data",(ulong)*in_RSI);
        }
        else {
          fprintf(_stdout,"                   %02x",(ulong)in_RSI[local_18]);
        }
      }
      else if (local_18 % 4 == 0) {
        fprintf(_stdout,"  %02x",(ulong)in_RSI[local_18]);
      }
      else if (local_18 % 8 == 7) {
        fprintf(_stdout," %02x\n",(ulong)in_RSI[local_18]);
      }
      else {
        fprintf(_stdout," %02x",(ulong)in_RSI[local_18]);
      }
    }
    if (local_18 % 8 != 0) {
      fprintf(_stdout,"\n");
    }
  }
  return;
}

Assistant:

static void
mcp251xfd_dump_ring_obj_data(const struct mcp251xfd_priv *priv,
			     const u8 *data, u8 dlc)
{
	int i;
	u8 len;

	len = can_dlc2len(get_canfd_dlc(dlc));

	if (!len) {
		pr_info("%16s = -none-\n", "data");
		return;
	}

	for (i = 0; i < len; i++) {
		if ((i % 8) == 0) {
			if (i == 0)
				pr_info("%16s = %02x", "data", data[i]);
			else
				pr_info("                   %02x", data[i]);
		} else if ((i % 4) == 0) {
			pr_cont("  %02x", data[i]);
		} else if ((i % 8) == 7) {
			pr_cont(" %02x\n", data[i]);
		} else {
			pr_cont(" %02x", data[i]);
		}
	}

	if (i % 8)
		pr_cont("\n");
}